

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O1

void M680X_get_insn_id(cs_struct *handle,cs_insn *insn,uint id)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  
  plVar1 = *(long **)((long)handle->printer_info + 0xf0);
  insn->id = 0x9f;
  lVar7 = -3;
  do {
    if ((plVar1[lVar7 + 0xc] == 0) || (lVar2 = plVar1[lVar7 + 9], lVar2 == 0)) break;
    if (*(char *)((long)plVar1 + lVar7 + 0x2b) == (char)(id >> 8)) {
      iVar8 = (int)plVar1[lVar7 + 0xc];
      uVar5 = 0xffffffff;
      if (iVar8 < 1) goto LAB_0026a874;
      iVar8 = iVar8 + -1;
      iVar3 = 0;
      iVar4 = iVar8;
      goto LAB_0026a83c;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0);
  if (((id & 0xff00) == 0) &&
     (uVar5 = *(uint *)(*plVar1 + (ulong)id * 4) & 0x1ff, insn->id = uVar5, uVar5 == 0x9f)) {
    lVar7 = 0;
    do {
      if (plVar1[lVar7 + 3] == 0) {
        return;
      }
      lVar2 = plVar1[lVar7 + 1];
      if (lVar2 == 0) {
        return;
      }
      iVar8 = (int)plVar1[lVar7 + 3];
      uVar5 = 0xffffffff;
      if (0 < iVar8) {
        iVar8 = iVar8 + -1;
        iVar3 = 0;
        iVar4 = iVar8;
        do {
          uVar5 = iVar8 / 2;
          uVar6 = (uint)*(byte *)(lVar2 + (long)(int)uVar5 * 4);
          if (uVar6 < (id & 0xff)) {
            iVar3 = uVar5 + 1;
          }
          else {
            if (uVar6 == (id & 0xff)) break;
            iVar4 = uVar5 - 1;
          }
          iVar8 = iVar4 + iVar3;
          uVar5 = 0xffffffff;
        } while (iVar3 <= iVar4);
      }
      if (-1 < (int)uVar5) goto LAB_0026a878;
      bVar9 = lVar7 == 0;
      lVar7 = lVar7 + 1;
    } while (bVar9);
  }
  return;
LAB_0026a83c:
  do {
    uVar5 = iVar8 / 2;
    uVar6 = (uint)*(byte *)(lVar2 + (long)(int)uVar5 * 4);
    if (uVar6 < (id & 0xff)) {
      iVar3 = uVar5 + 1;
    }
    else {
      if (uVar6 == (id & 0xff)) break;
      iVar4 = uVar5 - 1;
    }
    iVar8 = iVar4 + iVar3;
    uVar5 = 0xffffffff;
  } while (iVar3 <= iVar4);
LAB_0026a874:
  if ((int)uVar5 < 0) {
    uVar5 = 0x9f;
  }
  else {
LAB_0026a878:
    uVar5 = *(uint *)(lVar2 + (ulong)uVar5 * 4) >> 8 & 0x1ff;
  }
  insn->id = uVar5;
  return;
}

Assistant:

void M680X_get_insn_id(cs_struct *handle, cs_insn *insn, unsigned int id)
{
	const m680x_info *const info = (const m680x_info *)handle->printer_info;
	const cpu_tables *cpu = info->cpu;
	uint8_t insn_prefix = (id >> 8) & 0xff;
	int index;
	int i;

	insn->id = M680X_INS_ILLGL;

	for (i = 0; i < ARR_SIZE(cpu->pageX_prefix); ++i) {
		if (cpu->pageX_table_size[i] == 0 ||
			(cpu->inst_pageX_table[i] == NULL))
			break;

		if (cpu->pageX_prefix[i] == insn_prefix) {
			index = binary_search(cpu->inst_pageX_table[i],
					cpu->pageX_table_size[i], id & 0xff);
			insn->id = (index >= 0) ?
				cpu->inst_pageX_table[i][index].insn :
				M680X_INS_ILLGL;
			return;
		}
	}

	if (insn_prefix != 0)
		return;

	insn->id = cpu->inst_page1_table[id].insn;

	if (insn->id != M680X_INS_ILLGL)
		return;

	// Check if opcode byte is present in an overlay table
	for (i = 0; i < ARR_SIZE(cpu->overlay_table_size); ++i) {
		if (cpu->overlay_table_size[i] == 0 ||
			(cpu->inst_overlay_table[i] == NULL))
			break;

		if ((index = binary_search(cpu->inst_overlay_table[i],
						cpu->overlay_table_size[i],
						id & 0xff)) >= 0) {
			insn->id = cpu->inst_overlay_table[i][index].insn;
			return;
		}
	}
}